

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

void __thiscall CLPIParser::Extent_Start_Point(CLPIParser *this,uint8_t *buffer,uint dataLength)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  BitStreamReader reader;
  
  reader.super_BitStream.m_totalBits = 0;
  reader.m_curVal = 0;
  reader.m_bitLeft = 0;
  reader.super_BitStream.m_buffer = (uint *)0x0;
  reader.super_BitStream.m_initBuffer = (uint *)0x0;
  BitStreamReader::setBuffer(&reader,buffer,buffer + dataLength);
  BitStreamReader::skipBits(&reader,0x20);
  BitStreamReader::skipBits(&reader,0x10);
  uVar1 = BitStreamReader::getBits(&reader,0x10);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->SPN_extent_start,(long)(int)uVar1);
  uVar2 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = BitStreamReader::getBits(&reader,0x20);
    (this->SPN_extent_start).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[uVar2] = uVar1;
  }
  return;
}

Assistant:

void CLPIParser::Extent_Start_Point(uint8_t* buffer, const unsigned dataLength)
{
    BitStreamReader reader{};
    reader.setBuffer(buffer, buffer + dataLength);
    reader.skipBits(32);  // length

    reader.skipBits(16);  // reserved_for_future_use
    const int number_of_extent_start_points = reader.getBits<int>(16);
    SPN_extent_start.resize(number_of_extent_start_points);
    for (int i = 0; i < number_of_extent_start_points; ++i)
    {
        SPN_extent_start[i] = reader.getBits(32);
    }
}